

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_amigahunk.c
# Opt level: O0

void linedebug_hunks(GlobalVars *gv,FILE *f,LinkedSection *ls)

{
  long *plVar1;
  undefined8 *puVar2;
  long in_RDX;
  FILE *in_RSI;
  uint32_t *optr;
  uint32_t *lptr;
  uint32_t i;
  LineDebug *ldb;
  Section *nextsec;
  Section *sec;
  uint32_t in_stack_ffffffffffffffac;
  FILE *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  FILE *in_stack_ffffffffffffffc0;
  uint local_34;
  long *local_20;
  
  local_20 = *(long **)(in_RDX + 0x68);
  while (plVar1 = (long *)*local_20, plVar1 != (long *)0x0) {
    for (puVar2 = (undefined8 *)local_20[0x13]; local_20 = plVar1, puVar2 != (undefined8 *)0x0;
        puVar2 = (undefined8 *)*puVar2) {
      if ((*(char *)(puVar2 + 1) == '\x01') && (*(char *)((long)puVar2 + 9) == '\x01')) {
        fwrite32be(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
        in_stack_ffffffffffffffb0 = in_RSI;
        strlen32((char *)in_RSI);
        fwrite32be(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
        fwrite32be(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
        fwrite32be(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
        hunk_name_len(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        local_34 = 0;
        in_stack_ffffffffffffffc0 = (FILE *)puVar2[4];
        in_stack_ffffffffffffffb8 = (char *)puVar2[5];
        for (; local_34 < *(uint *)(puVar2 + 3); local_34 = local_34 + 1) {
          in_stack_ffffffffffffffc0 = (FILE *)&in_stack_ffffffffffffffc0->field_0x4;
          fwrite32be(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
          in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb8 + 4;
          fwrite32be(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
        }
      }
    }
  }
  return;
}

Assistant:

static void linedebug_hunks(struct GlobalVars *gv,FILE *f,
                            struct LinkedSection *ls)
{
  struct Section *sec = (struct Section *)ls->sections.first;
  struct Section *nextsec;
  struct LineDebug *ldb;

  while (nextsec = (struct Section *)sec->n.next) {
    if (ldb = (struct LineDebug *)sec->special) {
      do {
        if (ldb->tgext.id==TGEXT_AMIGAOS && ldb->tgext.sub_id==SUBID_LINE) {
          uint32_t i,*lptr,*optr;

          fwrite32be(f,HUNK_DEBUG);
          fwrite32be(f,3 + strlen32(ldb->source_name) +
                     (ldb->num_entries<<1));
          fwrite32be(f,(uint32_t)sec->offset);
          fwrite32be(f,0x4c494e45);  /* "LINE" */
          hunk_name_len(f,ldb->source_name);
          for (i=0,lptr=ldb->lines,optr=ldb->offsets;
               i<ldb->num_entries; i++) {
            fwrite32be(f,*lptr++);
            fwrite32be(f,*optr++);
          }
        }
      }
      while (ldb = (struct LineDebug *)ldb->tgext.next);
    }
    sec = nextsec;
  }
}